

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddRuntimeLinkLibrary(cmComputeLinkInformation *this,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  undefined8 uVar3;
  long *plVar4;
  cmValue cVar5;
  const_iterator cVar6;
  size_type *psVar7;
  key_type *pkVar8;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libsVec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [24];
  long lStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_100;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  LinkEntry local_90;
  
  cmGeneratorTarget::GetRuntimeLinkLibrary(&local_d0,this->Target,lang,&this->Config);
  if (local_d0._M_string_length != 0) {
    this_00 = this->Makefile;
    std::operator+(&local_b0,"CMAKE_",lang);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    pkVar8 = (key_type *)(plVar4 + 2);
    if ((key_type *)*plVar4 == pkVar8) {
      local_138._16_8_ = (pkVar8->_M_dataplus)._M_p;
      lStack_120 = plVar4[3];
      local_138._0_8_ = (key_type *)(local_138 + 0x10);
    }
    else {
      local_138._16_8_ = (pkVar8->_M_dataplus)._M_p;
      local_138._0_8_ = (key_type *)*plVar4;
    }
    local_138._8_8_ = plVar4[1];
    *plVar4 = (long)pkVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append(local_138,(ulong)local_d0._M_dataplus._M_p);
    paVar1 = &local_90.Item.Value.field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_90.Item.Value.field_2._M_allocated_capacity = *psVar7;
      local_90.Item.Value.field_2._8_8_ = plVar4[3];
      local_90.Item.Value._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.Item.Value.field_2._M_allocated_capacity = *psVar7;
      local_90.Item.Value._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_90.Item.Value._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    cVar5 = cmMakefile::GetDefinition(this_00,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.Item.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.Item.Value._M_dataplus._M_p,
                      local_90.Item.Value.field_2._M_allocated_capacity + 1);
    }
    if ((key_type *)local_138._0_8_ != (key_type *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_138._16_8_)->_M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar5.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138,arg,false);
      uVar3 = local_138._8_8_;
      if (local_138._0_8_ != local_138._8_8_) {
        pkVar8 = (key_type *)local_138._0_8_;
        do {
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&(this->ImplicitLinkLibs)._M_t,pkVar8);
          if ((_Rb_tree_header *)cVar6._M_node ==
              &(this->ImplicitLinkLibs)._M_t._M_impl.super__Rb_tree_header) {
            pcVar2 = (pkVar8->_M_dataplus)._M_p;
            local_158 = &local_148;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,pcVar2,pcVar2 + pkVar8->_M_string_length);
            local_118._M_allocated_capacity = 0;
            local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_118);
            local_100.Value._M_dataplus._M_p = (pointer)&local_100.Value.field_2;
            if (local_158 == &local_148) {
              local_100.Value.field_2._8_8_ = local_148._8_8_;
            }
            else {
              local_100.Value._M_dataplus._M_p = (pointer)local_158;
            }
            local_100.Value.field_2._M_allocated_capacity._1_7_ =
                 local_148._M_allocated_capacity._1_7_;
            local_100.Value.field_2._M_local_buf[0] = local_148._M_local_buf[0];
            local_100.Value._M_string_length = local_150;
            local_150 = 0;
            local_148._M_local_buf[0] = '\0';
            local_100.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_118._M_allocated_capacity;
            local_100.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
            local_118._M_allocated_capacity = 0;
            local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_158 = &local_148;
            cmComputeLinkDepends::LinkEntry::LinkEntry
                      (&local_90,&local_100,(cmGeneratorTarget *)0x0);
            AddItem(this,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90.Feature._M_dataplus._M_p != &local_90.Feature.field_2) {
              operator_delete(local_90.Feature._M_dataplus._M_p,
                              local_90.Feature.field_2._M_allocated_capacity + 1);
            }
            if (local_90.Item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_90.Item.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90.Item.Value._M_dataplus._M_p != &local_90.Item.Value.field_2) {
              operator_delete(local_90.Item.Value._M_dataplus._M_p,
                              local_90.Item.Value.field_2._M_allocated_capacity + 1);
            }
            if (local_100.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100.Value._M_dataplus._M_p != &local_100.Value.field_2) {
              operator_delete(local_100.Value._M_dataplus._M_p,
                              local_100.Value.field_2._M_allocated_capacity + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
            }
            if (local_158 != &local_148) {
              operator_delete(local_158,
                              CONCAT71(local_148._M_allocated_capacity._1_7_,
                                       local_148._M_local_buf[0]) + 1);
            }
          }
          pkVar8 = pkVar8 + 1;
        } while (pkVar8 != (key_type *)uVar3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddRuntimeLinkLibrary(std::string const& lang)
{
  std::string const& runtimeLibrary =
    this->Target->GetRuntimeLinkLibrary(lang, this->Config);
  if (runtimeLibrary.empty()) {
    return;
  }
  if (cmValue runtimeLinkOptions = this->Makefile->GetDefinition(
        "CMAKE_" + lang + "_RUNTIME_LIBRARY_LINK_OPTIONS_" + runtimeLibrary)) {
    std::vector<std::string> libsVec = cmExpandedList(*runtimeLinkOptions);
    for (std::string const& i : libsVec) {
      if (!cm::contains(this->ImplicitLinkLibs, i)) {
        this->AddItem({ i });
      }
    }
  }
}